

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

ostream * __thiscall
trompeloeil::
call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
::report_mismatch(call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
                  *this,ostream *os,
                 call_params_type_t<int_(float,_const_std::__cxx11::basic_string<char>_&)> *params)

{
  float fVar1;
  float *pfVar2;
  int iVar3;
  undefined8 in_RAX;
  char *__s;
  size_t sVar4;
  condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *cond;
  list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar5;
  undefined8 uStack_38;
  undefined4 extraout_var;
  
  this->reported = true;
  uStack_38 = in_RAX;
  (*(this->
    super_call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ).
    super_list_elem<trompeloeil::call_matcher_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ._vptr_list_elem[6])();
  pfVar2 = (params->
           super__Tuple_impl<0UL,_float_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).super__Head_base<0UL,_float_&,_false>._M_head_impl;
  fVar1 = (this->val).super__Tuple_impl<0UL,_float,_const_char_*>.
          super__Head_base<0UL,_float,_false>._M_head_impl;
  if (((fVar1 != *pfVar2) || (NAN(fVar1) || NAN(*pfVar2))) ||
     (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((params->
                      super__Tuple_impl<0UL,_float_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ).
                      super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      .
                      super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                      ._M_head_impl,
                      (this->val).super__Tuple_impl<0UL,_float,_const_char_*>.
                      super__Tuple_impl<1UL,_const_char_*>.
                      super__Head_base<1UL,_const_char_*,_false>._M_head_impl), iVar3 != 0)) {
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1);
    print_mismatch<float,float>
              (os,0,&(this->val).super__Tuple_impl<0UL,_float,_const_char_*>.
                     super__Head_base<0UL,_float,_false>._M_head_impl,
               (params->
               super__Tuple_impl<0UL,_float_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               ).super__Head_base<0UL,_float_&,_false>._M_head_impl);
    print_mismatch<char_const*,std::__cxx11::string>
              (os,1,(char **)&this->val,
               (params->
               super__Tuple_impl<0UL,_float_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               ).
               super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .
               super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
               ._M_head_impl);
  }
  else {
    plVar5 = (this->conditions).
             super_list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             .next;
    if (plVar5 != &(this->conditions).
                   super_list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
       ) {
      do {
        iVar3 = (*plVar5->_vptr_list_elem[2])(plVar5,params);
        if ((char)iVar3 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Failed WITH(",0xf);
          iVar3 = (*plVar5->_vptr_list_elem[3])(plVar5);
          __s = (char *)CONCAT44(extraout_var,iVar3);
          if (__s == (char *)0x0) {
            std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
          }
          else {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar4);
          }
          uStack_38._0_7_ = CONCAT16(0x29,(undefined6)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1);
        }
        plVar5 = plVar5->next;
      } while (plVar5 != &(this->conditions).
                          super_list_elem<trompeloeil::condition_base<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              );
    }
  }
  return os;
}

Assistant:

std::ostream&
    report_mismatch(
      std::ostream& os,
      call_params_type_t<Sig> const & params)
    override
    {
      reported = true;
      report_signature(os);
      if (match_parameters(val, params))
      {
        for (auto& cond : conditions)
        {
          if (!cond.check(params))
          {
            os << "\n  Failed WITH(" << cond.name() << ')';
          }
        }
      }
      else
      {
        os << '\n';
        ::trompeloeil::print_mismatch(os, val, params);
      }
      return os;
    }